

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::startThreads(FastText *this,TrainCallback *callback)

{
  long lVar1;
  rep rVar2;
  long *plVar3;
  int64_t iVar4;
  int *piVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  exception_ptr exception;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  long *local_90;
  thread local_88;
  long *local_80;
  vector<std::thread,_std::allocator<std::thread>_> local_78;
  timespec local_60;
  _Any_data local_50;
  code *local_40;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar2;
  LOCK();
  (this->tokenCount_).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->loss_)._M_i = -1.0;
  UNLOCK();
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.tv_sec = (__time_t)(this->trainException_)._M_exception_object;
  (this->trainException_)._M_exception_object = (void *)0x0;
  if ((FastText *)local_60.tv_sec != (FastText *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->thread
      < 2) {
    trainThread(this,0,callback);
  }
  else if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->thread) {
    iVar7 = 0;
    do {
      local_60.tv_nsec = CONCAT44(local_60.tv_nsec._4_4_,iVar7);
      local_60.tv_sec = (__time_t)this;
      std::function<void_(float,_float,_double,_double,_long)>::function
                ((function<void_(float,_float,_double,_double,_long)> *)&local_50,callback);
      local_88._M_id._M_thread = (id)0;
      plVar3 = (long *)operator_new(0x38);
      *plVar3 = (long)&PTR___State_impl_0014d8b0;
      plVar3[1] = local_60.tv_sec;
      *(undefined4 *)(plVar3 + 2) = (undefined4)local_60.tv_nsec;
      std::function<void_(float,_float,_double,_double,_long)>::function
                ((function<void_(float,_float,_double,_double,_long)> *)(plVar3 + 3),
                 (function<void_(float,_float,_double,_double,_long)> *)&local_50);
      local_90 = plVar3;
      std::thread::_M_start_thread(&local_88,&local_90,0);
      if (local_90 != (long *)0x0) {
        (**(code **)(*local_90 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&local_78,&local_88);
      if (local_88._M_id._M_thread != 0) {
        std::terminate();
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->thread);
  }
  iVar4 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  if (((this->tokenCount_).super___atomic_base<long>._M_i <
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->epoch
       * iVar4) && ((this->trainException_)._M_exception_object == (void *)0x0)) {
    do {
      local_60.tv_sec = 0;
      local_60.tv_nsec = 100000000;
      do {
        iVar7 = nanosleep(&local_60,&local_60);
        if (iVar7 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      if ((0.0 <= (this->loss_)._M_i) &&
         (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->verbose)) {
        lVar1 = (this->tokenCount_).super___atomic_base<long>._M_i;
        iVar7 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->epoch;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
        printInfo(this,(float)lVar1 / (float)(iVar7 * iVar4),(this->loss_)._M_i,
                  (ostream *)&std::cerr);
      }
    } while (((this->tokenCount_).super___atomic_base<long>._M_i <
              ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->epoch * iVar4) && ((this->trainException_)._M_exception_object == (void *)0x0));
  }
  if (local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      std::thread::join();
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)local_78.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  plVar3 = (long *)(this->trainException_)._M_exception_object;
  if (plVar3 != (long *)0x0) {
    local_90 = plVar3;
    std::__exception_ptr::exception_ptr::_M_addref();
    local_88._M_id._M_thread = (id)0;
    local_60.tv_sec = (__time_t)(this->trainException_)._M_exception_object;
    (this->trainException_)._M_exception_object = (void *)0x0;
    if ((void *)local_60.tv_sec != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_88._M_id._M_thread != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    local_80 = local_90;
    if (local_90 != (long *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    uVar6 = std::rethrow_exception((exception_ptr)&local_80);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
    _Unwind_Resume(uVar6);
  }
  if (0 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
    printInfo(this,1.0,(this->loss_)._M_i,(ostream *)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
  return;
}

Assistant:

void FastText::startThreads(const TrainCallback& callback) {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  trainException_ = nullptr;
  std::vector<std::thread> threads;
  if (args_->thread > 1) {
    for (int32_t i = 0; i < args_->thread; i++) {
      threads.push_back(std::thread([=]() { trainThread(i, callback); }));
    }
  } else {
    // webassembly can't instantiate `std::thread`
    trainThread(0, callback);
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (keepTraining(ntokens)) {
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < threads.size(); i++) {
    threads[i].join();
  }
  if (trainException_) {
    std::exception_ptr exception = trainException_;
    trainException_ = nullptr;
    std::rethrow_exception(exception);
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}